

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_encoder_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::LabelEncoderTest_empty_Test::TestBody(LabelEncoderTest_empty_Test *this)

{
  Label *label;
  char *message;
  internal local_80 [8];
  undefined8 *local_78;
  string local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  message = "";
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_const_char_(&)[1],_true>
            (&local_50,(char (*) [12])"first_label",(char (*) [1])0x13c5b3);
  LabelEncoderTest::Encode(&local_70,(LabelEncoderTest *)&local_50,label);
  testing::internal::CmpHelperEQ<char[22],std::__cxx11::string>
            (local_80,"\"/first_label@base64/=\"","Encode(Label{\"first_label\", \"\"})",
             (char (*) [22])"/first_label@base64/=",&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.second._M_dataplus._M_p != &local_50.second.field_2) {
    operator_delete(local_50.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != &local_50.first.field_2) {
    operator_delete(local_50.first._M_dataplus._M_p);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_78 != (undefined8 *)0x0) {
      message = (char *)*local_78;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/tests/internal/label_encoder_test.cc"
               ,0x1b,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_50.first._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50.first._M_dataplus._M_p + 8))();
    }
  }
  if (local_78 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_78 != local_78 + 2) {
      operator_delete((undefined8 *)*local_78);
    }
    operator_delete(local_78);
  }
  return;
}

Assistant:

TEST_F(LabelEncoderTest, empty) {
  EXPECT_EQ("/first_label@base64/=", Encode(Label{"first_label", ""}));
}